

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O2

int xmlNanoFTPCheckResponse(void *ctx)

{
  int iVar1;
  int iVar2;
  uint __i;
  int iVar3;
  long lVar4;
  timeval local_a8;
  fd_set rfd;
  
  iVar2 = -1;
  iVar3 = iVar2;
  if ((ctx != (void *)0x0) && (iVar1 = *(int *)((long)ctx + 0x44), iVar1 != -1)) {
    local_a8.tv_sec = 0;
    local_a8.tv_usec = 0;
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      rfd.__fds_bits[lVar4] = 0;
    }
    rfd.__fds_bits[iVar1 / 0x40] = rfd.__fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
    iVar3 = select(iVar1 + 1,(fd_set *)&rfd,(fd_set *)0x0,(fd_set *)0x0,&local_a8);
    if (iVar3 != 0) {
      if (iVar3 == -1) {
        __xmlIOErr(9,0,"select");
        iVar3 = iVar2;
      }
      else {
        iVar3 = xmlNanoFTPReadResponse(ctx);
      }
    }
  }
  return iVar3;
}

Assistant:

int
xmlNanoFTPCheckResponse(void *ctx) {
    xmlNanoFTPCtxtPtr ctxt = (xmlNanoFTPCtxtPtr) ctx;
    fd_set rfd;
    struct timeval tv;

    if ((ctxt == NULL) || (ctxt->controlFd == INVALID_SOCKET)) return(-1);
    tv.tv_sec = 0;
    tv.tv_usec = 0;
    FD_ZERO(&rfd);
    FD_SET(ctxt->controlFd, &rfd);
    switch(select(ctxt->controlFd + 1, &rfd, NULL, NULL, &tv)) {
	case 0:
	    return(0);
	case -1:
	    __xmlIOErr(XML_FROM_FTP, 0, "select");
	    return(-1);

    }

    return(xmlNanoFTPReadResponse(ctx));
}